

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::truncated_normal_dist<float>::cdf(truncated_normal_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  
  fVar2 = ((x - (this->P).mu_) / (this->P).sigma_) * 0.70710677;
  if (-0.47693625 <= fVar2) {
    if (fVar2 <= 0.47693625) {
      fVar2 = erff(fVar2);
      fVar2 = fVar2 * 0.5 + 0.5;
    }
    else {
      fVar2 = erfcf(fVar2);
      fVar2 = fVar2 * -0.5 + 1.0;
    }
  }
  else {
    fVar2 = erfcf(-fVar2);
    fVar2 = fVar2 * 0.5;
  }
  fVar1 = (this->P).Phi_a;
  return (fVar2 - fVar1) / ((this->P).Phi_b - fVar1);
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return (math::Phi(x) - P.Phi_a) / (P.Phi_b - P.Phi_a);
    }